

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::UniformCase::writeUniformDefinitions(UniformCase *this,ostringstream *dst)

{
  int iVar1;
  ostringstream *str;
  bool bVar2;
  int iVar3;
  UniformCollection *pUVar4;
  StructType *structPtr;
  ostream *poVar5;
  Uniform *pUVar6;
  char *__s;
  long lVar7;
  DeclareStructTypePtr DVar8;
  bool local_143;
  bool local_142;
  bool containsTypeSampler;
  dataTypePredicate (*typeReq) [2];
  undefined1 local_d8 [4];
  int compFuncNdx;
  byte local_bd;
  bool containsSamplers;
  allocator<char> local_a9;
  string local_a8;
  DeclareVariable local_88;
  int local_44;
  StructType *pSStack_40;
  int i_1;
  int local_38;
  DeclareStructTypePtr local_30;
  int local_1c;
  ostringstream *poStack_18;
  int i;
  ostringstream *dst_local;
  UniformCase *this_local;
  
  local_1c = 0;
  poStack_18 = dst;
  dst_local = (ostringstream *)this;
  while( true ) {
    iVar1 = local_1c;
    pUVar4 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    iVar3 = anon_unknown_1::UniformCollection::getNumStructTypes(pUVar4);
    str = poStack_18;
    if (iVar3 <= iVar1) break;
    pUVar4 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    structPtr = anon_unknown_1::UniformCollection::getStructType(pUVar4,local_1c);
    DVar8 = glu::declare(structPtr,0);
    pSStack_40 = DVar8.structPtr;
    local_38 = DVar8.indentLevel;
    local_30.structPtr = pSStack_40;
    local_30.indentLevel = local_38;
    poVar5 = glu::decl::operator<<
                       (&str->super_basic_ostream<char,_std::char_traits<char>_>,&local_30);
    std::operator<<(poVar5,";\n");
    local_1c = local_1c + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = local_44;
    pUVar4 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    iVar3 = anon_unknown_1::UniformCollection::getNumUniforms(pUVar4);
    if (iVar3 <= iVar1) break;
    poVar5 = std::operator<<(&poStack_18->super_basic_ostream<char,_std::char_traits<char>_>,
                             "uniform ");
    pUVar4 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    pUVar6 = anon_unknown_1::UniformCollection::getUniform(pUVar4,local_44);
    pUVar4 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    anon_unknown_1::UniformCollection::getUniform(pUVar4,local_44);
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s,&local_a9);
    glu::declare(&local_88,&pUVar6->type,&local_a8,0);
    poVar5 = glu::decl::operator<<(poVar5,&local_88);
    std::operator<<(poVar5,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    local_44 = local_44 + 1;
  }
  std::operator<<(&poStack_18->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  pUVar4 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>::
           operator->(&this->m_uniformCollection);
  anon_unknown_1::UniformCollection::getSamplerTypes
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_d8,pUVar4);
  bVar2 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::empty
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_d8);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::~vector
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_d8);
  local_bd = (bVar2 ^ 0xffU) & 1;
  typeReq._4_4_ = 0;
  do {
    if (0xe < typeReq._4_4_) {
      return;
    }
    lVar7 = (long)typeReq._4_4_;
    local_142 = false;
    if ((local_bd & 1) != 0) {
      bVar2 = (*writeUniformDefinitions::compareFuncs[lVar7].requiringTypes[0])(TYPE_FLOAT_VEC4);
      local_143 = true;
      if (!bVar2) {
        local_143 = (*writeUniformDefinitions::compareFuncs[lVar7].requiringTypes[1])
                              (TYPE_FLOAT_VEC4);
      }
      local_142 = local_143;
    }
    if (local_142 == false) {
      pUVar4 = de::
               SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>::
               operator->(&this->m_uniformCollection);
      bVar2 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        (pUVar4,writeUniformDefinitions::compareFuncs[lVar7].requiringTypes[0]);
      if (bVar2) goto LAB_019c7ec7;
      pUVar4 = de::
               SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>::
               operator->(&this->m_uniformCollection);
      bVar2 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        (pUVar4,writeUniformDefinitions::compareFuncs[lVar7].requiringTypes[1]);
      if (bVar2) goto LAB_019c7ec7;
    }
    else {
LAB_019c7ec7:
      poVar5 = std::operator<<(&poStack_18->super_basic_ostream<char,_std::char_traits<char>_>,
                               writeUniformDefinitions::compareFuncs[typeReq._4_4_].definition);
      std::operator<<(poVar5,"\n");
    }
    typeReq._4_4_ = typeReq._4_4_ + 1;
  } while( true );
}

Assistant:

void UniformCase::writeUniformDefinitions (std::ostringstream& dst) const
{
	for (int i = 0; i < (int)m_uniformCollection->getNumStructTypes(); i++)
		dst << glu::declare(m_uniformCollection->getStructType(i)) << ";\n";

	for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
		dst << "uniform " << glu::declare(m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str()) << ";\n";

	dst << "\n";

	{
		static const struct
		{
			dataTypePredicate	requiringTypes[2];
			const char*			definition;
		} compareFuncs[] =
		{
			{ { glu::isDataTypeFloatOrVec,				glu::isDataTypeMatrix				}, "mediump float compare_float    (mediump float a, mediump float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }"																		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC2>,	dataTypeIsMatrixWithNRows<2>		}, "mediump float compare_vec2     (mediump vec2 a, mediump vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }"														},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC3>,	dataTypeIsMatrixWithNRows<3>		}, "mediump float compare_vec3     (mediump vec3 a, mediump vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }"								},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC4>,	dataTypeIsMatrixWithNRows<4>		}, "mediump float compare_vec4     (mediump vec4 a, mediump vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }"		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2     (mediump mat2 a, mediump mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3     (mediump mat3 a, mediump mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4     (mediump mat4 a, mediump mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_INT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_int      (mediump int a, mediump int b)      { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC2>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec2    (mediump ivec2 a, mediump ivec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC3>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec3    (mediump ivec3 a, mediump ivec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC4>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec4    (mediump ivec4 a, mediump ivec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bool     (bool a, bool b)                    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec2    (bvec2 a, bvec2 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec3    (bvec3 a, bvec3 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec4    (bvec4 a, bvec4 b)                  { return a == b ? 1.0 : 0.0; }"																					}
		};

		const bool containsSamplers = !m_uniformCollection->getSamplerTypes().empty();

		for (int compFuncNdx = 0; compFuncNdx < DE_LENGTH_OF_ARRAY(compareFuncs); compFuncNdx++)
		{
			const dataTypePredicate		(&typeReq)[2]			= compareFuncs[compFuncNdx].requiringTypes;
			const bool					containsTypeSampler		= containsSamplers && (typeReq[0](glu::TYPE_FLOAT_VEC4) || typeReq[1](glu::TYPE_FLOAT_VEC4));

			if (containsTypeSampler || m_uniformCollection->containsMatchingBasicType(typeReq[0]) || m_uniformCollection->containsMatchingBasicType(typeReq[1]))
				dst << compareFuncs[compFuncNdx].definition << "\n";
		}
	}
}